

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O1

ssize_t __thiscall QGifHandler::read(QGifHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  QGIFFormat *pQVar1;
  char cVar2;
  int iVar3;
  ssize_t sVar4;
  long *plVar5;
  uchar *buffer;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->gifFormat->newFrame == false) {
    do {
      if ((this->buffer).d.size == 0) {
        QImageIOHandler::device();
        QIODevice::read((longlong)local_50);
        QByteArray::append(&this->buffer);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],1,0x10);
          }
        }
        if ((this->buffer).d.size == 0) break;
      }
      buffer = (uchar *)(this->buffer).d.ptr;
      if (buffer == (uchar *)0x0) {
        buffer = (uchar *)&QByteArray::_empty;
      }
      iVar3 = QGIFFormat::decode(this->gifFormat,&this->lastImage,buffer,(int)(this->buffer).d.size,
                                 &this->nextDelay,&this->loopCnt);
      if (iVar3 == -1) break;
      QByteArray::remove((longlong)&this->buffer,0);
    } while (this->gifFormat->newFrame != true);
  }
  if (this->gifFormat->newFrame == false) {
    if (this->gifFormat->partialNewFrame == true) {
      plVar5 = (long *)QImageIOHandler::device();
      cVar2 = (**(code **)(*plVar5 + 0x90))(plVar5);
      if (cVar2 != '\0') goto LAB_00105322;
    }
    sVar4 = 0;
  }
  else {
LAB_00105322:
    QImage::operator=((QImage *)CONCAT44(in_register_00000034,__fd),&this->lastImage);
    this->frameNumber = this->frameNumber + 1;
    pQVar1 = this->gifFormat;
    pQVar1->newFrame = false;
    pQVar1->partialNewFrame = false;
    sVar4 = CONCAT71((int7)((ulong)pQVar1 >> 8),1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return sVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QGifHandler::read(QImage *image)
{
    const int GifChunkSize = 4096;

    while (!gifFormat->newFrame) {
        if (buffer.isEmpty()) {
            buffer += device()->read(GifChunkSize);
            if (buffer.isEmpty())
                break;
        }

        int decoded = gifFormat->decode(&lastImage, (const uchar *)buffer.constData(), buffer.size(),
                                        &nextDelay, &loopCnt);
        if (decoded == -1)
            break;
        buffer.remove(0, decoded);
    }
    if (gifFormat->newFrame || (gifFormat->partialNewFrame && device()->atEnd())) {
        *image = lastImage;
        ++frameNumber;
        gifFormat->newFrame = false;
        gifFormat->partialNewFrame = false;
        return true;
    }

    return false;
}